

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ColourImpl *pCVar5;
  ulong uVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong *puVar10;
  size_t skippedRatio;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  ColourGuard local_90;
  ColourImpl local_80;
  ulong local_70 [4];
  ColourGuard local_50;
  ColourGuard local_40;
  
  uVar1 = (totals->testCases).passed;
  uVar2 = (totals->testCases).failed;
  uVar3 = (totals->testCases).failedButOk;
  uVar4 = (totals->testCases).skipped;
  uVar9 = uVar2 + uVar1 + uVar3 + uVar4;
  if (uVar9 == 0) {
    pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if (pCVar5 != (ColourImpl *)0x0) {
      poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      local_90.m_code = BrightYellow;
      local_90._12_4_ = local_90._12_4_ & 0xffffff00;
      local_90.m_colourImpl = pCVar5;
      ColourImpl::ColourGuard::engageImpl(&local_90,poVar8);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,'O');
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_b0,local_a8);
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if (local_90.m_engaged == true) {
        (*(local_90.m_colourImpl)->_vptr_ColourImpl[2])(local_90.m_colourImpl,0);
      }
LAB_00161977:
      local_b0 = (long *)CONCAT71(local_b0._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,(char *)&local_b0,1
                );
      return;
    }
  }
  else {
    uVar7 = (uVar2 * 0x50) / uVar9;
    local_70[3] = uVar7;
    if (uVar2 * 0x50 < uVar9) {
      local_70[3] = 1;
    }
    if (uVar2 == 0) {
      local_70[3] = uVar7;
    }
    uVar7 = (uVar3 * 0x50) / uVar9;
    local_70[2] = uVar7;
    if (uVar3 * 0x50 < uVar9) {
      local_70[2] = 1;
    }
    if (uVar3 == 0) {
      local_70[2] = uVar7;
    }
    uVar7 = (uVar1 * 0x50) / uVar9;
    local_70[1] = uVar7;
    if (uVar1 * 0x50 < uVar9) {
      local_70[1] = 1;
    }
    if (uVar1 == 0) {
      local_70[1] = uVar7;
    }
    uVar7 = (uVar4 * 0x50) / uVar9;
    local_70[0] = 1;
    if (uVar9 <= uVar4 * 0x50) {
      local_70[0] = uVar7;
    }
    if (uVar4 == 0) {
      local_70[0] = uVar7;
    }
    uVar9 = local_70[2] + local_70[3] + local_70[1];
    if (uVar9 + local_70[0] < 0x4f) {
      do {
        if ((((local_70[3] <= local_70[2]) || (local_70[3] <= local_70[1])) ||
            (puVar10 = local_70 + 3, local_70[3] <= local_70[0])) &&
           (((local_70[2] <= local_70[1] || (puVar10 = local_70 + 2, local_70[2] <= local_70[0])) &&
            (puVar10 = local_70 + 1, local_70[1] <= local_70[0])))) {
          puVar10 = local_70;
        }
        *puVar10 = *puVar10 + 1;
        uVar9 = local_70[2] + local_70[3] + local_70[1];
      } while (uVar9 + local_70[0] < 0x4f);
    }
    if (0x4f < uVar9) {
      do {
        puVar10 = local_70 + 3;
        if ((((local_70[3] <= local_70[1] || local_70[3] <= local_70[2]) ||
              local_70[3] <= local_70[0]) &&
            (puVar10 = local_70 + 2, local_70[2] <= local_70[1] || local_70[2] <= local_70[0])) &&
           (puVar10 = local_70 + 1, local_70[1] <= local_70[0])) {
          puVar10 = local_70;
        }
        *puVar10 = *puVar10 - 1;
      } while (0x4f < local_70[2] + local_70[3] + local_70[1]);
    }
    uVar6 = local_70[3];
    uVar7 = local_70[2];
    uVar9 = local_70[1];
    pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if (pCVar5 != (ColourImpl *)0x0) {
      poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      local_40.m_code = BrightRed;
      local_40.m_engaged = false;
      local_40.m_colourImpl = pCVar5;
      ColourImpl::ColourGuard::engageImpl(&local_40,poVar8);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar6);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_b0,local_a8);
      pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
      if (pCVar5 != (ColourImpl *)0x0) {
        local_50.m_code = BrightYellow;
        local_50.m_engaged = false;
        local_50.m_colourImpl = pCVar5;
        ColourImpl::ColourGuard::engageImpl(&local_50,poVar8);
        local_90.m_colourImpl = &local_80;
        std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,(char *)local_90.m_colourImpl,CONCAT44(local_90._12_4_,local_90.m_code));
        if (local_90.m_colourImpl != &local_80) {
          operator_delete(local_90.m_colourImpl,(long)local_80._vptr_ColourImpl + 1);
        }
        if (local_50.m_engaged == true) {
          (*(local_50.m_colourImpl)->_vptr_ColourImpl[2])(local_50.m_colourImpl,0);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
        if (local_40.m_engaged == true) {
          (*(local_40.m_colourImpl)->_vptr_ColourImpl[2])(local_40.m_colourImpl,0);
        }
        poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
        if ((((totals->testCases).failed == 0) && ((totals->testCases).failedButOk == 0)) &&
           ((totals->testCases).skipped == 0)) {
          pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
          if (pCVar5 == (ColourImpl *)0x0) goto LAB_0016199f;
          local_90.m_code = BrightGreen;
          local_90._12_4_ = (uint)(uint3)local_90._13_3_ << 8;
          local_90.m_colourImpl = pCVar5;
          ColourImpl::ColourGuard::engageImpl(&local_90,poVar8);
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_b0,local_a8);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if (local_90.m_engaged == true) {
            (*(local_90.m_colourImpl)->_vptr_ColourImpl[2])(local_90.m_colourImpl,0);
          }
        }
        else {
          pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
          if (pCVar5 == (ColourImpl *)0x0) goto LAB_0016199f;
          local_90.m_code = Green;
          local_90._12_4_ = (uint)(uint3)local_90._13_3_ << 8;
          local_90.m_colourImpl = pCVar5;
          ColourImpl::ColourGuard::engageImpl(&local_90,poVar8);
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_b0,local_a8);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if (local_90.m_engaged == true) {
            (*(local_90.m_colourImpl)->_vptr_ColourImpl[2])(local_90.m_colourImpl,0);
          }
        }
        pCVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
        if (pCVar5 != (ColourImpl *)0x0) {
          poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
          local_90.m_code = FileName;
          local_90._12_4_ = local_90._12_4_ & 0xffffff00;
          local_90.m_colourImpl = pCVar5;
          ColourImpl::ColourGuard::engageImpl(&local_90,poVar8);
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct((ulong)&local_b0,(char)local_70[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_b0,local_a8);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if (local_90.m_engaged == true) {
            (*(local_90.m_colourImpl)->_vptr_ColourImpl[2])(local_90.m_colourImpl,0);
          }
          goto LAB_00161977;
        }
      }
    }
  }
LAB_0016199f:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]"
               );
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        std::size_t skippedRatio = makeRatio(totals.testCases.skipped, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio + skippedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)--;

        m_stream << m_colour->guardColour( Colour::Error )
                 << std::string( failedRatio, '=' )
                 << m_colour->guardColour( Colour::ResultExpectedFailure )
                 << std::string( failedButOkRatio, '=' );
        if ( totals.testCases.allPassed() ) {
            m_stream << m_colour->guardColour( Colour::ResultSuccess )
                     << std::string( passedRatio, '=' );
        } else {
            m_stream << m_colour->guardColour( Colour::Success )
                     << std::string( passedRatio, '=' );
        }
        m_stream << m_colour->guardColour( Colour::Skip )
                 << std::string( skippedRatio, '=' );
    } else {
        m_stream << m_colour->guardColour( Colour::Warning )
                 << std::string( CATCH_CONFIG_CONSOLE_WIDTH - 1, '=' );
    }
    m_stream << '\n';
}